

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,ArrayPtr<const_char> input,Builder output)

{
  StructDataBitCount *this_00;
  Builder output_00;
  Reader input_00;
  Reader local_1b8;
  SegmentBuilder *local_188;
  SegmentBuilder *pSStack_180;
  CapTableBuilder *local_178;
  void *pvStack_170;
  WirePointer *local_168;
  char *local_158;
  size_t sStack_150;
  undefined1 auStack_138 [8];
  Builder json;
  MallocMessageBuilder message;
  JsonCodec *this_local;
  ArrayPtr<const_char> input_local;
  
  this_00 = &json._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>((Builder *)auStack_138,(MessageBuilder *)this_00);
  local_168 = json._builder.pointers;
  local_178 = json._builder.capTable;
  pvStack_170 = json._builder.data;
  local_188 = (SegmentBuilder *)auStack_138;
  pSStack_180 = json._builder.segment;
  output_00._builder.capTable = (CapTableBuilder *)json._builder.segment;
  output_00._builder.segment = (SegmentBuilder *)auStack_138;
  output_00._builder.data = json._builder.capTable;
  output_00._builder.pointers = (WirePointer *)json._builder.data;
  output_00._builder._32_8_ = json._builder.pointers;
  local_158 = input.ptr;
  sStack_150 = input.size_;
  decodeRaw(this,input,output_00);
  capnp::json::Value::Builder::operator_cast_to_Reader(&local_1b8,(Builder *)auStack_138);
  input_00._reader.capTable = local_1b8._reader.capTable;
  input_00._reader.segment = local_1b8._reader.segment;
  input_00._reader.data = local_1b8._reader.data;
  input_00._reader.pointers = local_1b8._reader.pointers;
  input_00._reader.dataSize = local_1b8._reader.dataSize;
  input_00._reader.pointerCount = local_1b8._reader.pointerCount;
  input_00._reader._38_2_ = local_1b8._reader._38_2_;
  input_00._reader.nestingLimit = local_1b8._reader.nestingLimit;
  input_00._reader._44_4_ = local_1b8._reader._44_4_;
  decode(this,input_00,output);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&json._builder.dataSize);
  return;
}

Assistant:

void JsonCodec::decode(kj::ArrayPtr<const char> input, DynamicStruct::Builder output) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  decodeRaw(input, json);
  decode(json, output);
}